

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O1

uint32_t kratos::SortInitialVisitor::get_order(shared_ptr<kratos::Stmt> *stmt)

{
  int iVar1;
  uint32_t uVar2;
  undefined1 local_28 [8];
  shared_ptr<kratos::StmtBlock> block;
  
  uVar2 = 0;
  if (((stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type_ == Block)
  {
    Stmt::as<kratos::StmtBlock>((Stmt *)local_28);
    iVar1 = *(int *)((long)local_28 + 0xd8);
    if (block.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 block.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    uVar2 = (uint32_t)(iVar1 == 4);
  }
  return uVar2;
}

Assistant:

static uint32_t get_order(const std::shared_ptr<Stmt>& stmt) {
        if (stmt->type() != StatementType::Block) return 0;
        auto block = stmt->as<StmtBlock>();
        if (block->block_type() != StatementBlockType::Initial) return 0;
        return 1;
    }